

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deps_log.cc
# Opt level: O1

Node * __thiscall DepsLog::GetFirstReverseDepsNode(DepsLog *this,Node *node)

{
  pointer ppDVar1;
  Deps *pDVar2;
  bool bVar3;
  Node *in_RAX;
  long lVar4;
  long lVar5;
  long lVar6;
  
  ppDVar1 = (this->deps_).super__Vector_base<DepsLog::Deps_*,_std::allocator<DepsLog::Deps_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  lVar4 = (long)(this->deps_).super__Vector_base<DepsLog::Deps_*,_std::allocator<DepsLog::Deps_*>_>.
                _M_impl.super__Vector_impl_data._M_finish - (long)ppDVar1;
  if (lVar4 == 0) {
    return (Node *)0x0;
  }
  lVar4 = lVar4 >> 3;
  lVar6 = 0;
  do {
    pDVar2 = ppDVar1[lVar6];
    if (pDVar2 == (Deps *)0x0) {
      bVar3 = false;
    }
    else {
      bVar3 = false;
      if (0 < (long)pDVar2->node_count) {
        lVar5 = 0;
        do {
          if (pDVar2->nodes[lVar5] == node) {
            in_RAX = (this->nodes_).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                     super__Vector_impl_data._M_start[lVar6];
            bVar3 = true;
            break;
          }
          lVar5 = lVar5 + 1;
        } while (pDVar2->node_count != lVar5);
      }
    }
    if (bVar3) {
      return in_RAX;
    }
    lVar6 = lVar6 + 1;
    if (lVar6 == lVar4 + (ulong)(lVar4 == 0)) {
      return (Node *)0x0;
    }
  } while( true );
}

Assistant:

Node* DepsLog::GetFirstReverseDepsNode(Node* node) {
  for (size_t id = 0; id < deps_.size(); ++id) {
    Deps* deps = deps_[id];
    if (!deps)
      continue;
    for (int i = 0; i < deps->node_count; ++i) {
      if (deps->nodes[i] == node)
        return nodes_[id];
    }
  }
  return NULL;
}